

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

int32 Js::JavascriptNumber::GetNonzeroInt32Value_NoTaggedIntCheck(Var object)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  undefined4 *puVar4;
  double value;
  
  if (object == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0xa4,"(object)","object");
    if (!bVar2) goto LAB_00ce8f53;
    *puVar4 = 0;
  }
  if (((ulong)object & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)object & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ce8f53;
    *puVar4 = 0;
  }
  if (((ulong)object & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0xa5,"(!TaggedInt::Is(object))","!TaggedInt::Is(object)");
    if (!bVar2) {
LAB_00ce8f53:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  iVar3 = 0;
  if ((ulong)object >> 0x32 != 0) {
    value = (double)((ulong)object ^ 0xfffc000000000000);
    iVar3 = 0;
    if (((double)(int)value == value) && (!NAN((double)(int)value) && !NAN(value))) {
      bVar2 = NumberUtilities::IsSpecial(value,0x8000000000000000);
      iVar3 = 0;
      if (!bVar2) {
        iVar3 = (int)value;
      }
    }
  }
  return iVar3;
}

Assistant:

int32 JavascriptNumber::GetNonzeroInt32Value_NoTaggedIntCheck(const Var object)
    {
        Assert(object);
        Assert(!TaggedInt::Is(object));

        int32 i;
        return Is_NoTaggedIntCheck(object) && TryGetInt32Value(GetValue(object), &i) ? i : 0;
    }